

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O0

string * __thiscall
Test::Formats::to_string_abi_cxx11_(string *__return_storage_ptr__,Formats *this,void *ptr)

{
  allocator<char> local_39;
  char local_38 [8];
  char buffer [32];
  void *ptr_local;
  
  buffer._24_8_ = this;
  snprintf(local_38,0x20,"%p",this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_38,&local_39);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::to_string(const void *ptr) {
  char buffer[32];
#ifdef _MSC_VER
  sprintf_s(buffer, sizeof(buffer), "%p", ptr);
#else
  snprintf(buffer, sizeof(buffer), "%p", ptr);
#endif
  return buffer;
}